

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderProgramResource.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderProgramResourceTest::initTest(GeometryShaderProgramResourceTest *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  GLuint GVar4;
  deUint32 err;
  undefined4 extraout_var;
  char **ppcVar6;
  TestError *this_00;
  char *pcVar7;
  char *pcVar8;
  char **ppcVar9;
  pointer_____offset_0x10___ *ppuVar10;
  char **ppcVar11;
  uint n_sh2_body_parts;
  char *vertex_shader_code_parts [8];
  char *local_88;
  char *local_80 [8];
  GLint maxGSStorageBlocks;
  GLint maxVSStorageBlocks;
  GLint maxGSAtomicCounters;
  GLint maxVSAtomicCounters;
  long lVar5;
  
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_00,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderProgramResource.cpp"
               ,0xcd);
    ppuVar10 = &tcu::NotSupportedError::typeinfo;
    goto LAB_00cf7d0a;
  }
  ppcVar11 = local_80 + 3;
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  maxVSAtomicCounters = 0;
  (**(code **)(lVar5 + 0x868))(0x92cc,&maxVSAtomicCounters);
  maxGSAtomicCounters = 0;
  (**(code **)(lVar5 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS,
             &maxGSAtomicCounters);
  this->m_atomic_counters_supported = 0 < maxGSAtomicCounters && 1 < maxVSAtomicCounters;
  maxVSStorageBlocks = 0;
  (**(code **)(lVar5 + 0x868))(0x90d6,&maxVSStorageBlocks);
  maxGSStorageBlocks = 0;
  (**(code **)(lVar5 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_SHADER_STORAGE_BLOCKS,
             &maxGSStorageBlocks);
  bVar2 = 1 < maxVSStorageBlocks;
  bVar1 = 0 < maxGSStorageBlocks;
  this->m_ssbos_supported = bVar1 && bVar2;
  vertex_shader_code_parts[0] =
       "${VERSION}\n\nprecision highp float;\n\n// uniforms included here\n";
  pcVar7 = 
  "// uniforms\nuniform mat4 uni_model_view_projection; // not referenced in GS\nuniform vec4 uni_colors_white;          // referenced in GS\n\n// uniforms blocks\nuniform Matrices\n{\n    mat4 model;\n    mat4 view;\n    mat4 projection;\n} uni_matrices; // not referenced at all\n\nuniform Colors\n{\n    vec4 red;\n    vec4 green;\n    vec4 blue;\n} uni_colors; // referenced in GS\n\n"
  ;
  vertex_shader_code_parts[1] =
       "// uniforms\nuniform mat4 uni_model_view_projection; // not referenced in GS\nuniform vec4 uni_colors_white;          // referenced in GS\n\n// uniforms blocks\nuniform Matrices\n{\n    mat4 model;\n    mat4 view;\n    mat4 projection;\n} uni_matrices; // not referenced at all\n\nuniform Colors\n{\n    vec4 red;\n    vec4 green;\n    vec4 blue;\n} uni_colors; // referenced in GS\n\n"
  ;
  if (this->m_atomic_counters_supported == true) {
    vertex_shader_code_parts[2] =
         "// atomic counter buffers\nlayout (binding = 0) uniform atomic_uint uni_atom_horizontal; // not referenced in GS\nlayout (binding = 1) uniform atomic_uint uni_atom_vertical;   // referenced in GS\n\n"
    ;
    if (bVar1 && bVar2) {
      ppcVar11 = local_80 + 5;
      vertex_shader_code_parts[3] =
           "// ssbos\nbuffer Positions\n{\n    vec4 position[4]; // referenced in GS\n} storage_positions;  // referenced in GS\n\nbuffer Ids\n{\n    int ids[4]; // not referenced in GS\n} storage_ids;  // not referenced in GS\n\n"
      ;
      vertex_shader_code_parts[4] =
           "// attributes\nin vec4 vs_in_position; // not referenced in GS\nin vec4 vs_in_color;    // not referenced in GS\n\n// output\nout vec4 vs_out_color; // referenced in GS\n\nvoid main()\n{\n    gl_Position  = uni_model_view_projection * vs_in_position;\n    vs_out_color = vs_in_color;\n"
      ;
      vertex_shader_code_parts[5] =
           "    // write atomic counters\n    if (0.0 <= gl_Position.x)\n    {\n        atomicCounterIncrement(uni_atom_vertical);\n    }\n\n    if (0.0 <= gl_Position.y)\n    {\n        atomicCounterIncrement(uni_atom_horizontal);\n    }\n"
      ;
      vertex_shader_code_parts[6] =
           "    // write shader storage buffers\n    storage_positions.position[gl_VertexID] = gl_Position;\n    storage_ids.ids[gl_VertexID]            = gl_VertexID;\n"
      ;
      vertex_shader_code_parts[7] = "}\n";
      local_80[0] = 
      "// uniforms\nuniform mat4 uni_model_view_projection; // not referenced in GS\nuniform vec4 uni_colors_white;          // referenced in GS\n\n// uniforms blocks\nuniform Matrices\n{\n    mat4 model;\n    mat4 view;\n    mat4 projection;\n} uni_matrices; // not referenced at all\n\nuniform Colors\n{\n    vec4 red;\n    vec4 green;\n    vec4 blue;\n} uni_colors; // referenced in GS\n\n"
      ;
      local_80[1] = 
      "// atomic counter buffers\nlayout (binding = 0) uniform atomic_uint uni_atom_horizontal; // not referenced in GS\nlayout (binding = 1) uniform atomic_uint uni_atom_vertical;   // referenced in GS\n\n"
      ;
      local_80[2] = 
      "// ssbos\nbuffer Positions\n{\n    vec4 position[4]; // referenced in GS\n} storage_positions;  // referenced in GS\n\nbuffer Ids\n{\n    int ids[4]; // not referenced in GS\n} storage_ids;  // not referenced in GS\n\n"
      ;
      local_80[3] = 
      "// input from vs + gl_Position\nin vec4 vs_out_color[1];\n\nout vec4 gs_out_color;\n\nvoid main()\n{\n    // access uniform\n    gl_Position = vec4(0, 0, 0, 0);\n    gs_out_color = uni_colors_white;\n    EmitVertex();\n\n    // access uniform block\n    gl_Position = gl_in[0].gl_Position + vec4(-0.1, 0.1, 0, 0);\n    gs_out_color = vs_out_color[0] + uni_colors.red;\n    EmitVertex();\n\n    gl_Position = gl_in[0].gl_Position + vec4(-0.1, -0.1, 0, 0);\n    gs_out_color = vs_out_color[0] + uni_colors.green;\n    EmitVertex();\n\n    gl_Position = gl_in[0].gl_Position + vec4(0.1, -0.1, 0, 0);\n    gs_out_color = vs_out_color[0] + uni_colors.blue;\n    EmitVertex();\n"
      ;
      n_sh2_body_parts = 8;
      pcVar8 = 
      "    // access shader storage buffers\n    gl_Position = storage_positions.position[0] + vec4(0.1, 0.1, 0, 0);\n    gs_out_color     = vec4(1.0);\n    EmitVertex();\n"
      ;
      pcVar7 = 
      "    // access atomic counter\n    gl_Position = vec4(0, 0, 0, 0);\n    uint  counter = atomicCounter(uni_atom_vertical);\n    gs_out_color     = vec4(counter / 255u);\n    EmitVertex();\n"
      ;
      ppcVar6 = local_80 + 6;
      ppcVar9 = local_80 + 4;
    }
    else {
      vertex_shader_code_parts[4] =
           "    // write atomic counters\n    if (0.0 <= gl_Position.x)\n    {\n        atomicCounterIncrement(uni_atom_vertical);\n    }\n\n    if (0.0 <= gl_Position.y)\n    {\n        atomicCounterIncrement(uni_atom_horizontal);\n    }\n"
      ;
      local_80[1] = 
      "// atomic counter buffers\nlayout (binding = 0) uniform atomic_uint uni_atom_horizontal; // not referenced in GS\nlayout (binding = 1) uniform atomic_uint uni_atom_vertical;   // referenced in GS\n\n"
      ;
      pcVar8 = 
      "    // access atomic counter\n    gl_Position = vec4(0, 0, 0, 0);\n    uint  counter = atomicCounter(uni_atom_vertical);\n    gs_out_color     = vec4(counter / 255u);\n    EmitVertex();\n"
      ;
LAB_00cf7b89:
      local_80[0] = 
      "// uniforms\nuniform mat4 uni_model_view_projection; // not referenced in GS\nuniform vec4 uni_colors_white;          // referenced in GS\n\n// uniforms blocks\nuniform Matrices\n{\n    mat4 model;\n    mat4 view;\n    mat4 projection;\n} uni_matrices; // not referenced at all\n\nuniform Colors\n{\n    vec4 red;\n    vec4 green;\n    vec4 blue;\n} uni_colors; // referenced in GS\n\n"
      ;
      vertex_shader_code_parts[5] = "}\n";
      vertex_shader_code_parts[3] =
           "// attributes\nin vec4 vs_in_position; // not referenced in GS\nin vec4 vs_in_color;    // not referenced in GS\n\n// output\nout vec4 vs_out_color; // referenced in GS\n\nvoid main()\n{\n    gl_Position  = uni_model_view_projection * vs_in_position;\n    vs_out_color = vs_in_color;\n"
      ;
      n_sh2_body_parts = 6;
      pcVar7 = 
      "// input from vs + gl_Position\nin vec4 vs_out_color[1];\n\nout vec4 gs_out_color;\n\nvoid main()\n{\n    // access uniform\n    gl_Position = vec4(0, 0, 0, 0);\n    gs_out_color = uni_colors_white;\n    EmitVertex();\n\n    // access uniform block\n    gl_Position = gl_in[0].gl_Position + vec4(-0.1, 0.1, 0, 0);\n    gs_out_color = vs_out_color[0] + uni_colors.red;\n    EmitVertex();\n\n    gl_Position = gl_in[0].gl_Position + vec4(-0.1, -0.1, 0, 0);\n    gs_out_color = vs_out_color[0] + uni_colors.green;\n    EmitVertex();\n\n    gl_Position = gl_in[0].gl_Position + vec4(0.1, -0.1, 0, 0);\n    gs_out_color = vs_out_color[0] + uni_colors.blue;\n    EmitVertex();\n"
      ;
      ppcVar9 = local_80 + 2;
      ppcVar6 = local_80 + 4;
    }
  }
  else {
    if (bVar1 && bVar2) {
      vertex_shader_code_parts[2] =
           "// ssbos\nbuffer Positions\n{\n    vec4 position[4]; // referenced in GS\n} storage_positions;  // referenced in GS\n\nbuffer Ids\n{\n    int ids[4]; // not referenced in GS\n} storage_ids;  // not referenced in GS\n\n"
      ;
      vertex_shader_code_parts[4] =
           "    // write shader storage buffers\n    storage_positions.position[gl_VertexID] = gl_Position;\n    storage_ids.ids[gl_VertexID]            = gl_VertexID;\n"
      ;
      local_80[1] = 
      "// ssbos\nbuffer Positions\n{\n    vec4 position[4]; // referenced in GS\n} storage_positions;  // referenced in GS\n\nbuffer Ids\n{\n    int ids[4]; // not referenced in GS\n} storage_ids;  // not referenced in GS\n\n"
      ;
      pcVar8 = 
      "    // access shader storage buffers\n    gl_Position = storage_positions.position[0] + vec4(0.1, 0.1, 0, 0);\n    gs_out_color     = vec4(1.0);\n    EmitVertex();\n"
      ;
      goto LAB_00cf7b89;
    }
    ppcVar11 = local_80 + 1;
    ppcVar9 = local_80;
    vertex_shader_code_parts[2] =
         "// attributes\nin vec4 vs_in_position; // not referenced in GS\nin vec4 vs_in_color;    // not referenced in GS\n\n// output\nout vec4 vs_out_color; // referenced in GS\n\nvoid main()\n{\n    gl_Position  = uni_model_view_projection * vs_in_position;\n    vs_out_color = vs_in_color;\n"
    ;
    vertex_shader_code_parts[3] = "}\n";
    n_sh2_body_parts = 4;
    pcVar8 = 
    "// input from vs + gl_Position\nin vec4 vs_out_color[1];\n\nout vec4 gs_out_color;\n\nvoid main()\n{\n    // access uniform\n    gl_Position = vec4(0, 0, 0, 0);\n    gs_out_color = uni_colors_white;\n    EmitVertex();\n\n    // access uniform block\n    gl_Position = gl_in[0].gl_Position + vec4(-0.1, 0.1, 0, 0);\n    gs_out_color = vs_out_color[0] + uni_colors.red;\n    EmitVertex();\n\n    gl_Position = gl_in[0].gl_Position + vec4(-0.1, -0.1, 0, 0);\n    gs_out_color = vs_out_color[0] + uni_colors.green;\n    EmitVertex();\n\n    gl_Position = gl_in[0].gl_Position + vec4(0.1, -0.1, 0, 0);\n    gs_out_color = vs_out_color[0] + uni_colors.blue;\n    EmitVertex();\n"
    ;
    ppcVar6 = local_80 + 2;
  }
  local_88 = 
  "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\nprecision highp float;\n\nlayout (points)                           in;\nlayout (triangle_strip, max_vertices = 6) out;\n\n// uniforms included here\n"
  ;
  *ppcVar9 = pcVar7;
  *ppcVar11 = pcVar8;
  *ppcVar6 = "}\n";
  GVar4 = (**(code **)(lVar5 + 0x3f0))(0x8b30);
  this->m_fragment_shader_id = GVar4;
  GVar4 = (**(code **)(lVar5 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
  this->m_geometry_shader_id = GVar4;
  GVar4 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
  this->m_vertex_shader_id = GVar4;
  GVar4 = (**(code **)(lVar5 + 0x3c8))();
  this->m_program_object_id = GVar4;
  err = (**(code **)(lVar5 + 0x800))();
  glu::checkError(err,"Could not create program object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderProgramResource.cpp"
                  ,0x138);
  bVar2 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_program_object_id,this->m_fragment_shader_id,
                     1,&m_fragment_shader_code,this->m_geometry_shader_id,n_sh2_body_parts,&local_88
                     ,this->m_vertex_shader_id,n_sh2_body_parts,vertex_shader_code_parts,(bool *)0x0
                    );
  if (bVar2) {
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Could not create program from valid vertex/geometry/fragment shader",
             (char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderProgramResource.cpp"
             ,0x141);
  ppuVar10 = &tcu::TestError::typeinfo;
LAB_00cf7d0a:
  __cxa_throw(this_00,ppuVar10,tcu::Exception::~Exception);
}

Assistant:

void GeometryShaderProgramResourceTest::initTest()
{
	/* Check if geometry_shader extension is supported */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint maxVSAtomicCounters = 0;
	gl.getIntegerv(GL_MAX_VERTEX_ATOMIC_COUNTER_BUFFERS, &maxVSAtomicCounters);

	glw::GLint maxGSAtomicCounters = 0;
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS, &maxGSAtomicCounters);

	m_atomic_counters_supported = maxVSAtomicCounters >= 2 && maxGSAtomicCounters >= 1;

	glw::GLint maxVSStorageBlocks = 0;
	gl.getIntegerv(GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS, &maxVSStorageBlocks);

	glw::GLint maxGSStorageBlocks = 0;
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_SHADER_STORAGE_BLOCKS, &maxGSStorageBlocks);

	m_ssbos_supported = maxVSStorageBlocks >= 2 && maxGSStorageBlocks >= 1;

	glw::GLuint nCodeParts = 0;
	const char* vertex_shader_code_parts[8];
	const char* geometry_shader_code_parts[8];

	/* Vertex & geometry shaders */
	if (m_atomic_counters_supported && m_ssbos_supported)
	{
		vertex_shader_code_parts[0] = m_vertex_shader_code_preamble;
		vertex_shader_code_parts[1] = m_common_shader_code_definitions_body;
		vertex_shader_code_parts[2] = m_common_shader_code_definitions_atomic_counter_body;
		vertex_shader_code_parts[3] = m_common_shader_code_definitions_ssbo_body;
		vertex_shader_code_parts[4] = m_vertex_shader_code_body;
		vertex_shader_code_parts[5] = m_vertex_shader_code_atomic_counter_body;
		vertex_shader_code_parts[6] = m_vertex_shader_code_ssbo_body;
		vertex_shader_code_parts[7] = "}\n";

		geometry_shader_code_parts[0] = m_geometry_shader_code_preamble;
		geometry_shader_code_parts[1] = m_common_shader_code_definitions_body;
		geometry_shader_code_parts[2] = m_common_shader_code_definitions_atomic_counter_body;
		geometry_shader_code_parts[3] = m_common_shader_code_definitions_ssbo_body;
		geometry_shader_code_parts[4] = m_geometry_shader_code_body;
		geometry_shader_code_parts[5] = m_geometry_shader_code_atomic_counter_body;
		geometry_shader_code_parts[6] = m_geometry_shader_code_ssbo_body;
		geometry_shader_code_parts[7] = "}\n";

		nCodeParts = 8;
	}
	else if (m_atomic_counters_supported)
	{
		vertex_shader_code_parts[0] = m_vertex_shader_code_preamble;
		vertex_shader_code_parts[1] = m_common_shader_code_definitions_body;
		vertex_shader_code_parts[2] = m_common_shader_code_definitions_atomic_counter_body;
		vertex_shader_code_parts[3] = m_vertex_shader_code_body;
		vertex_shader_code_parts[4] = m_vertex_shader_code_atomic_counter_body;
		vertex_shader_code_parts[5] = "}\n";

		geometry_shader_code_parts[0] = m_geometry_shader_code_preamble;
		geometry_shader_code_parts[1] = m_common_shader_code_definitions_body;
		geometry_shader_code_parts[2] = m_common_shader_code_definitions_atomic_counter_body;
		geometry_shader_code_parts[3] = m_geometry_shader_code_body;
		geometry_shader_code_parts[4] = m_geometry_shader_code_atomic_counter_body;
		geometry_shader_code_parts[5] = "}\n";

		nCodeParts = 6;
	}
	else if (m_ssbos_supported)
	{
		vertex_shader_code_parts[0] = m_vertex_shader_code_preamble;
		vertex_shader_code_parts[1] = m_common_shader_code_definitions_body;
		vertex_shader_code_parts[2] = m_common_shader_code_definitions_ssbo_body;
		vertex_shader_code_parts[3] = m_vertex_shader_code_body;
		vertex_shader_code_parts[4] = m_vertex_shader_code_ssbo_body;
		vertex_shader_code_parts[5] = "}\n";

		geometry_shader_code_parts[0] = m_geometry_shader_code_preamble;
		geometry_shader_code_parts[1] = m_common_shader_code_definitions_body;
		geometry_shader_code_parts[2] = m_common_shader_code_definitions_ssbo_body;
		geometry_shader_code_parts[3] = m_geometry_shader_code_body;
		geometry_shader_code_parts[4] = m_geometry_shader_code_ssbo_body;
		geometry_shader_code_parts[5] = "}\n";

		nCodeParts = 6;
	}
	else
	{
		vertex_shader_code_parts[0] = m_vertex_shader_code_preamble;
		vertex_shader_code_parts[1] = m_common_shader_code_definitions_body;
		vertex_shader_code_parts[2] = m_vertex_shader_code_body;
		vertex_shader_code_parts[3] = "}\n";

		geometry_shader_code_parts[0] = m_geometry_shader_code_preamble;
		geometry_shader_code_parts[1] = m_common_shader_code_definitions_body;
		geometry_shader_code_parts[2] = m_geometry_shader_code_body;
		geometry_shader_code_parts[3] = "}\n";

		nCodeParts = 4;
	}

	/* Create shader objects */
	m_fragment_shader_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_geometry_shader_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_vertex_shader_id   = gl.createShader(GL_VERTEX_SHADER);

	/* Create program object */
	m_program_object_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create program object");

	/* Build program object */
	if (true !=
		buildProgram(m_program_object_id, m_fragment_shader_id, 1,				 /* Fragment shader parts number */
					 &m_fragment_shader_code, m_geometry_shader_id, nCodeParts,  /* Geometry shader parts number */
					 geometry_shader_code_parts, m_vertex_shader_id, nCodeParts, /* Vertex shader parts number */
					 vertex_shader_code_parts))
	{
		TCU_FAIL("Could not create program from valid vertex/geometry/fragment shader");
	}
}